

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::Resize<idx2::stack_string<128>>(array<idx2::stack_string<128>_> *Array,i64 NewSize)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  stack_string<128> *local_b8;
  stack_string<128> local_a9;
  i64 local_28;
  i64 NewSize_local;
  array<idx2::stack_string<128>_> *Array_local;
  i64 local_10;
  
  local_28 = NewSize;
  NewSize_local = (i64)Array;
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::stack_string<128>>(Array,NewSize);
  }
  if (*(long *)(NewSize_local + 0x18) < local_28) {
    local_10 = NewSize_local;
    lVar1 = *(long *)NewSize_local;
    lVar2 = *(long *)(NewSize_local + 0x18);
    Array_local = (array<idx2::stack_string<128>_> *)NewSize_local;
    lVar3 = *(long *)NewSize_local;
    lVar4 = local_28 * 0x81;
    local_b8 = &local_a9;
    do {
      local_b8->Data[0] = '\0';
      local_b8 = (stack_string<128> *)(local_b8->Data + 1);
    } while (local_b8 != (stack_string<128> *)&local_a9.Len);
    local_a9.Len = '\0';
    Fill<idx2::stack_string<128>*,idx2::stack_string<128>>
              ((stack_string<128> *)(lVar1 + lVar2 * 0x81),(stack_string<128> *)(lVar3 + lVar4),
               &local_a9);
  }
  *(i64 *)(NewSize_local + 0x18) = local_28;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}